

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib652.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int local_44;
  int size;
  int i;
  curl_slist *recipients;
  curl_mimepart *part;
  curl_mime *mime;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  part = (curl_mimepart *)0x0;
  _size = 0;
  for (local_44 = 0; local_44 < 0x6a4; local_44 = local_44 + 1) {
    memset(buffer + local_44 * 10,local_44 % 0x1a + 0x41U & 0xff,10);
  }
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      mime._4_4_ = 0x7e;
    }
    else {
      part = (curl_mimepart *)curl_mime_init(lVar2);
      if (part == (curl_mimepart *)0x0) {
        curl_mfprintf(_stderr,"curl_mime_init() failed\n");
        mime._4_4_ = 0x7e;
      }
      else {
        lVar3 = curl_mime_addpart(part);
        if (lVar3 == 0) {
          curl_mfprintf(_stderr,"curl_mime_addpart() failed\n");
          mime._4_4_ = 0x7e;
        }
        else {
          mime._4_4_ = curl_mime_filename(lVar3,"myfile.jpg");
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_type(lVar3,"image/jpeg");
            if (mime._4_4_ == 0) {
              mime._4_4_ = curl_mime_data(lVar3,buffer,17000);
              if (mime._4_4_ == 0) {
                mime._4_4_ = curl_mime_encoder(lVar3,"base64");
                if (mime._4_4_ == 0) {
                  _size = curl_slist_append(0,"someone@example.com");
                  if (_size == 0) {
                    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
                  }
                  else {
                    mime._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
                    if ((((mime._4_4_ == 0) &&
                         (mime._4_4_ = curl_easy_setopt(lVar2,0x27ca,"somebody@example.com"),
                         mime._4_4_ == 0)) &&
                        (mime._4_4_ = curl_easy_setopt(lVar2,0x27cb,_size), mime._4_4_ == 0)) &&
                       ((mime._4_4_ = curl_easy_setopt(lVar2,0x281d,part), mime._4_4_ == 0 &&
                        (mime._4_4_ = curl_easy_setopt(lVar2,0x29,1), mime._4_4_ == 0)))) {
                      mime._4_4_ = curl_easy_perform(lVar2);
                    }
                  }
                }
                else {
                  curl_mfprintf(_stderr,"curl_mime_encoder() failed\n");
                }
              }
              else {
                curl_mfprintf(_stderr,"curl_mime_data() failed\n");
              }
            }
            else {
              curl_mfprintf(_stderr,"curl_mime_type() failed\n");
            }
          }
          else {
            curl_mfprintf(_stderr,"curl_mime_filename() failed\n");
          }
        }
      }
    }
    curl_easy_cleanup(lVar2);
    curl_mime_free(part);
    curl_slist_free_all(_size);
    curl_global_cleanup();
    URL_local._4_4_ = mime._4_4_;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  struct curl_slist *recipients = NULL;

  /* create a buffer with AAAA...BBBBB...CCCC...etc */
  int i;
  int size = (int)sizeof(buffer) / 10;

  for(i = 0; i < size ; i++)
    memset(&buffer[i * 10], 65 + (i % 26), 10);

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.jpg");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_type(part, "image/jpeg");
  if(res) {
    fprintf(stderr, "curl_mime_type() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "base64");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* Prepare recipients. */
  recipients = curl_slist_append(NULL, "someone@example.com");
  if(!recipients) {
    fprintf(stderr, "curl_slist_append() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Set sender. */
  test_setopt(curl, CURLOPT_MAIL_FROM, "somebody@example.com");

  /* Set recipients. */
  test_setopt(curl, CURLOPT_MAIL_RCPT, recipients);

  /* send a multi-part mail */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  /* cleanup the recipients. */
  curl_slist_free_all(recipients);

  curl_global_cleanup();

  return res;
}